

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

UINT16 TPMU_PUBLIC_PARMS_Marshal
                 (TPMU_PUBLIC_PARMS *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT16 UVar1;
  UINT16 UVar2;
  UINT16 UVar3;
  
  if (selector == 1) {
    UVar1 = TPMT_SYM_DEF_OBJECT_Marshal((TPMT_SYM_DEF_OBJECT *)&source->keyedHashDetail,buffer,size)
    ;
    UVar2 = TPMT_RSA_SCHEME_Marshal(&(source->rsaDetail).scheme,buffer,size);
    UINT16_Marshal(&(source->rsaDetail).keyBits,buffer,size);
    UINT32_Marshal(&(source->rsaDetail).exponent,buffer,size);
    return UVar1 + UVar2 + 6;
  }
  if (selector == 0x25) {
    UINT16_Marshal((UINT16 *)source,buffer,size);
    UVar1 = TPMU_SYM_KEY_BITS_Marshal
                      ((TPMU_SYM_KEY_BITS *)&(source->keyedHashDetail).scheme.details,buffer,size,
                       (uint)(source->keyedHashDetail).scheme.scheme);
    UVar2 = TPMU_SYM_MODE_Marshal
                      ((TPMU_SYM_MODE *)((long)&(source->keyedHashDetail).scheme.details + 2),buffer
                       ,size,(uint)(source->keyedHashDetail).scheme.scheme);
    return UVar2 + UVar1 + 2;
  }
  if (selector == 0x23) {
    UVar1 = TPMT_SYM_DEF_OBJECT_Marshal((TPMT_SYM_DEF_OBJECT *)&source->keyedHashDetail,buffer,size)
    ;
    UVar2 = TPMT_ECC_SCHEME_Marshal(&(source->eccDetail).scheme,buffer,size);
    UINT16_Marshal(&(source->rsaDetail).keyBits,buffer,size);
    UVar3 = TPMT_KDF_SCHEME_Marshal(&(source->eccDetail).kdf,buffer,size);
    return UVar3 + UVar2 + UVar1 + 2;
  }
  if (selector != 8) {
    return 0;
  }
  UINT16_Marshal((UINT16 *)source,buffer,size);
  UVar1 = TPMU_SCHEME_KEYEDHASH_Marshal
                    (&(source->keyedHashDetail).scheme.details,buffer,size,
                     (uint)(source->keyedHashDetail).scheme.scheme);
  return UVar1 + 2;
}

Assistant:

UINT16
TPMU_PUBLIC_PARMS_Marshal(TPMU_PUBLIC_PARMS *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPMS_KEYEDHASH_PARMS_Marshal((TPMS_KEYEDHASH_PARMS *)&(source->keyedHashDetail), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPMS_SYMCIPHER_PARMS_Marshal((TPMS_SYMCIPHER_PARMS *)&(source->symDetail), buffer, size);
#endif // ALG_SYMCIPHER
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPMS_RSA_PARMS_Marshal((TPMS_RSA_PARMS *)&(source->rsaDetail), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPMS_ECC_PARMS_Marshal((TPMS_ECC_PARMS *)&(source->eccDetail), buffer, size);
#endif // ALG_ECC
    }
    return 0;
}